

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::MethodOptions::MergePartialFromCodedStream
          (MethodOptions *this,CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  Type *value;
  uint32 tag;
  
  do {
    while( true ) {
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar1 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0x1f3a) break;
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      if (tag < 8000) {
        bVar2 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
      }
      else {
        bVar2 = internal::ExtensionSet::ParseField
                          (&this->_extensions_,tag,input,default_instance_,&this->_unknown_fields_);
      }
      if (bVar2 == false) {
        return false;
      }
    }
    while( true ) {
      value = internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase);
      bVar2 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                        (input,value);
      if (!bVar2) {
        return false;
      }
      puVar1 = input->buffer_;
      if (((*(int *)&input->buffer_end_ - (int)puVar1 < 2) || (*puVar1 != 0xba)) ||
         (puVar1[1] != '>')) break;
      input->buffer_ = puVar1 + 2;
    }
    bVar2 = io::CodedInputStream::ExpectAtEnd(input);
  } while (!bVar2);
  return true;
}

Assistant:

bool MethodOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}